

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool __thiscall Jupiter::File::load(File *this,char *file)

{
  Data *this_00;
  bool bVar1;
  FILE *__stream;
  size_t __len2;
  
  __stream = fopen(file,"rb");
  if (__stream == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    this_00 = this->m_data;
    if ((this_00->fileName)._M_string_length == 0) {
      __len2 = strlen(file);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&this_00->fileName,0,0,file,__len2);
    }
    bVar1 = load(this,(FILE *)__stream);
    fclose(__stream);
  }
  return bVar1;
}

Assistant:

bool Jupiter::File::load(const char *file) {
	FILE *filePtr = fopen(file, "rb");
	if (filePtr == nullptr) {
		return false;
	}

	if (m_data->fileName.empty()) {
		m_data->fileName = file;
	}

	bool result = load(filePtr);
	fclose(filePtr);
	return result;
}